

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_database.cpp
# Opt level: O2

void __thiscall
OpenCorruptStore_HeaderBadSignature2_Test::~OpenCorruptStore_HeaderBadSignature2_Test
          (OpenCorruptStore_HeaderBadSignature2_Test *this)

{
  anon_unknown.dwarf_59778::OpenCorruptStore::~OpenCorruptStore(&this->super_OpenCorruptStore);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F (OpenCorruptStore, HeaderBadSignature2) {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
    // Modify the signature2 field.
    auto * const h = this->get_header ();
    auto & s2 = h->a.signature2;
    s2 = !s2;
    h->crc = h->get_crc ();
    this->check_database_open (pstore::error_code::header_corrupt);
#endif // PSTORE_SIGNATURE_CHECKS_ENABLED
}